

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>
wasm::Builder::makeGlobal(Name name,Type type,Expression *init,Mutability mutable_)

{
  undefined8 *puVar1;
  long lVar2;
  __uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> _Var3;
  undefined4 in_register_00000084;
  int in_R9D;
  
  _Var3.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Global>();
  puVar1 = *(undefined8 **)
            _Var3.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = type.id;
  lVar2 = *(long *)_Var3.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
  *(Expression **)(lVar2 + 0x38) = init;
  *(ulong *)(lVar2 + 0x40) = CONCAT44(in_register_00000084,mutable_);
  *(bool *)(*(long *)_Var3.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                     .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) =
       in_R9D == 0;
  return (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
         (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
         _Var3.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Global>
  makeGlobal(Name name, Type type, Expression* init, Mutability mutable_) {
    auto glob = std::make_unique<Global>();
    glob->name = name;
    glob->type = type;
    glob->init = init;
    glob->mutable_ = mutable_ == Mutable;
    return glob;
  }